

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_interpreter_applyCoercionToASTNodeIntoType
          (sysbvm_context_t *context,sysbvm_tuple_t astNode_,sysbvm_tuple_t environment_,
          sysbvm_tuple_t targetType_)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  undefined1 local_70 [6];
  _Bool isReceiverType;
  _Bool isDecayedType;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_40_5_5b8d8dc5 gcFrame;
  sysbvm_tuple_t targetType__local;
  sysbvm_tuple_t environment__local;
  sysbvm_tuple_t astNode__local;
  sysbvm_context_t *context_local;
  
  gcFrameRecord.roots = (sysbvm_tuple_t *)targetType_;
  memset(local_70,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_70);
  if (gcFrameRecord.roots == (sysbvm_tuple_t *)0x0) {
    gcFrameRecord.roots = (sysbvm_tuple_t *)(context->roots).decayedTypeInferenceType;
  }
  gcFrame.nodeType = astNode_;
  if (gcFrameRecord.roots != (sysbvm_tuple_t *)(context->roots).directTypeInferenceType) {
    sVar2 = sysbvm_astNode_getAnalyzedType(astNode_);
    if (gcFrameRecord.roots == (sysbvm_tuple_t *)(context->roots).decayedTypeInferenceType) {
      gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_type_decay(context,sVar2);
    }
    else if (gcFrameRecord.roots == (sysbvm_tuple_t *)(context->roots).receiverTypeInferenceType) {
      gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_type_decayReceiver(context,sVar2);
    }
    if ((gcFrameRecord.roots != (sysbvm_tuple_t *)0x0) &&
       (_Var1 = sysbvm_type_isDirectSubtypeOf(sVar2,(sysbvm_tuple_t)gcFrameRecord.roots), !_Var1)) {
      sVar2 = sysbvm_tuple_send2(context,(context->roots).coerceASTNodeWithEnvironmentSelector,
                                 (sysbvm_tuple_t)gcFrameRecord.roots,astNode_,environment_);
      gcFrame.nodeType =
           sysbvm_interpreter_analyzeASTIfNeededWithEnvironment(context,sVar2,environment_);
    }
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_70);
  return gcFrame.nodeType;
}

Assistant:

static sysbvm_tuple_t sysbvm_interpreter_applyCoercionToASTNodeIntoType(sysbvm_context_t *context, sysbvm_tuple_t astNode_, sysbvm_tuple_t environment_, sysbvm_tuple_t targetType_)
{
    struct {
        sysbvm_tuple_t targetType;
        sysbvm_tuple_t environment;
        sysbvm_tuple_t nodeType;
        sysbvm_tuple_t result;

        sysbvm_tuple_t coercionExpressionType;
    } gcFrame = {
        .result = astNode_,
        .targetType = targetType_,
        .environment = environment_
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    if(!gcFrame.targetType)
        gcFrame.targetType = context->roots.decayedTypeInferenceType;

    // We do not need to perform type checking when just passing the type.
    if(gcFrame.targetType != context->roots.directTypeInferenceType)
    {
        gcFrame.nodeType = sysbvm_astNode_getAnalyzedType(gcFrame.result);
        bool isDecayedType = gcFrame.targetType == context->roots.decayedTypeInferenceType;
        bool isReceiverType = gcFrame.targetType == context->roots.receiverTypeInferenceType;

        if(isDecayedType)
            gcFrame.targetType = sysbvm_type_decay(context, gcFrame.nodeType);
        else if(isReceiverType)
            gcFrame.targetType = sysbvm_type_decayReceiver(context, gcFrame.nodeType);

        if(gcFrame.targetType && !sysbvm_type_isDirectSubtypeOf(gcFrame.nodeType, gcFrame.targetType))
        {
            gcFrame.result = sysbvm_tuple_send2(context, context->roots.coerceASTNodeWithEnvironmentSelector, gcFrame.targetType, gcFrame.result, gcFrame.environment);
            gcFrame.result = sysbvm_interpreter_analyzeASTIfNeededWithEnvironment(context, gcFrame.result, gcFrame.environment);
        }
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}